

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O0

void prepare_coeffs_12tap(InterpFilterParams *filter_params,int subpel_q4,__m128i *coeffs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int16_t *piVar3;
  undefined4 *in_RDX;
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m128i coeffs_y;
  int16_t *y_filter;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  piVar3 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  uVar1 = *(undefined8 *)piVar3;
  uVar2 = *(undefined8 *)(piVar3 + 4);
  local_58 = (undefined4)uVar1;
  *in_RDX = local_58;
  in_RDX[1] = local_58;
  in_RDX[2] = local_58;
  in_RDX[3] = local_58;
  uStack_54 = (undefined4)((ulong)uVar1 >> 0x20);
  in_RDX[4] = uStack_54;
  in_RDX[5] = uStack_54;
  in_RDX[6] = uStack_54;
  in_RDX[7] = uStack_54;
  uStack_50 = (undefined4)uVar2;
  in_RDX[8] = uStack_50;
  in_RDX[9] = uStack_50;
  in_RDX[10] = uStack_50;
  in_RDX[0xb] = uStack_50;
  uStack_4c = (undefined4)((ulong)uVar2 >> 0x20);
  in_RDX[0xc] = uStack_4c;
  in_RDX[0xd] = uStack_4c;
  in_RDX[0xe] = uStack_4c;
  in_RDX[0xf] = uStack_4c;
  uVar1 = *(undefined8 *)(piVar3 + 8);
  local_58 = (undefined4)uVar1;
  in_RDX[0x10] = local_58;
  in_RDX[0x11] = local_58;
  in_RDX[0x12] = local_58;
  in_RDX[0x13] = local_58;
  uStack_54 = (undefined4)((ulong)uVar1 >> 0x20);
  in_RDX[0x14] = uStack_54;
  in_RDX[0x15] = uStack_54;
  in_RDX[0x16] = uStack_54;
  in_RDX[0x17] = uStack_54;
  return;
}

Assistant:

static inline void prepare_coeffs_12tap(const InterpFilterParams *filter_params,
                                        int subpel_q4,
                                        __m128i *coeffs /* [6] */) {
  const int16_t *const y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

  coeffs[0] = _mm_shuffle_epi32(coeffs_y, 0);    // coeffs 0 1 0 1 0 1 0 1
  coeffs[1] = _mm_shuffle_epi32(coeffs_y, 85);   // coeffs 2 3 2 3 2 3 2 3
  coeffs[2] = _mm_shuffle_epi32(coeffs_y, 170);  // coeffs 4 5 4 5 4 5 4 5
  coeffs[3] = _mm_shuffle_epi32(coeffs_y, 255);  // coeffs 6 7 6 7 6 7 6 7

  coeffs_y = _mm_loadl_epi64((__m128i *)(y_filter + 8));

  coeffs[4] = _mm_shuffle_epi32(coeffs_y, 0);  // coeffs 8 9 8 9 8 9 8 9
  coeffs[5] =
      _mm_shuffle_epi32(coeffs_y, 85);  // coeffs 10 11 10 11 10 11 10 11
}